

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

char __thiscall CheaterBotStrategy::yesOrNo(CheaterBotStrategy *this,StrategyContext context)

{
  int iVar1;
  
  if (context == REINFORCE) {
    cheaterReinforce(this);
  }
  else {
    if (context != FORTIFY) {
      if (context != ATTACK) {
        return -1;
      }
      iVar1 = cheaterAttack(this);
      return (char)iVar1;
    }
    cheaterFortify(this);
  }
  return '\x01';
}

Assistant:

signed char CheaterBotStrategy::yesOrNo(StrategyContext context) {
    switch (context) {
        case ATTACK:
            return (signed char) this->cheaterAttack();
        case REINFORCE:
            return (signed char) this->cheaterReinforce();
        case FORTIFY:
            return (signed char) this->cheaterFortify();
        default:
            return -1;
    }
}